

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O0

void __thiscall Pathie::entry_iterator::open_native_handle(entry_iterator *this)

{
  char *pcVar1;
  DIR *pDVar2;
  ErrnoError *this_00;
  int *piVar3;
  allocator local_89;
  string local_88 [32];
  Pathie local_68 [32];
  dirent *local_48;
  dirent *p_dirent;
  undefined1 local_30 [8];
  string nstr;
  entry_iterator *this_local;
  
  Path::native_abi_cxx11_((Path *)local_30);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pDVar2 = opendir(pcVar1);
  this->mp_cur = pDVar2;
  if (this->mp_cur != (void *)0x0) {
    local_48 = readdir((DIR *)this->mp_cur);
    pcVar1 = local_48->d_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,pcVar1,&local_89);
    filename_to_utf8(local_68,(string *)local_88);
    Path::operator=(this->mp_cur_path,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string((string *)local_30);
    return;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar3 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar3);
  __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
}

Assistant:

void entry_iterator::open_native_handle()
{
#if defined(_PATHIE_UNIX)
  std::string nstr = mp_directory->native();
  mp_cur = opendir(nstr.c_str());

  if (mp_cur) {
    struct dirent* p_dirent = readdir(static_cast<DIR*>(mp_cur));
    *mp_cur_path = filename_to_utf8(p_dirent->d_name);
  }
  else {
    throw(Pathie::ErrnoError(errno));
  }
#elif defined(_WIN32)
  std::wstring utf16 = utf8_to_utf16(mp_directory->str() + "/*");
  WIN32_FIND_DATAW finddata;

  mp_cur = FindFirstFileW(utf16.c_str(), &finddata);
  if (static_cast<HANDLE>(mp_cur) == INVALID_HANDLE_VALUE) {
    DWORD err = GetLastError();
    mp_cur = NULL;
    throw(Pathie::WindowsError(err));
  }
  else {
    *mp_cur_path = utf16_to_utf8(finddata.cFileName);
  }
#else
#error Unsupported system
#endif
}